

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_equation_units.cpp
# Opt level: O0

void __thiscall logUnits_general_Test::~logUnits_general_Test(logUnits_general_Test *this)

{
  logUnits_general_Test *this_local;
  
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST(logUnits, general)
{
    double res = convert(
        20.0,
        precise::log::dBA * precise::m / precise::s,
        precise::m / precise::s);
    EXPECT_DOUBLE_EQ(res, 10.0);
    res = convert(
        100.0,
        precise::m / precise::s,
        precise::log::dBA * precise::m / precise::s);
    EXPECT_DOUBLE_EQ(res, 40.0);

    res = convert(
        10.0,
        precise::log::dBP * precise::km / precise::hr,
        precise::m / precise::s);
    EXPECT_DOUBLE_EQ(res, 10000.0 / 3600.0);
    res = convert(
        100000.0 / 3600.0,
        precise::m / precise::s,
        precise::log::dBP * precise::km / precise::hr);
    EXPECT_DOUBLE_EQ(res, 20.0);
}